

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O3

exr_result_t exr_attr_list_destroy(exr_context_t ctxt,exr_attribute_list_t *list)

{
  exr_result_t eVar1;
  exr_result_t eVar2;
  exr_attribute_t **ppeVar3;
  long lVar4;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else if (list == (exr_attribute_list_t *)0x0) {
    eVar2 = 0;
  }
  else {
    ppeVar3 = list->entries;
    if (ppeVar3 == (exr_attribute_t **)0x0) {
      eVar2 = 0;
    }
    else {
      if (list->num_attributes < 1) {
        eVar2 = 0;
      }
      else {
        lVar4 = 0;
        eVar2 = 0;
        do {
          eVar1 = attr_destroy((_internal_exr_context *)ctxt,list->entries[lVar4]);
          if (eVar1 != 0) {
            eVar2 = eVar1;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < list->num_attributes);
        ppeVar3 = list->entries;
      }
      (**(code **)(ctxt + 0x60))(ppeVar3);
    }
    list->num_attributes = 0;
    list->num_alloced = 0;
    list->entries = (exr_attribute_t **)0x0;
    list->sorted_entries = (exr_attribute_t **)0x0;
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_list_destroy (exr_context_t ctxt, exr_attribute_list_t* list)
{
    exr_attribute_list_t nil = {0};
    exr_result_t         arv;
    exr_result_t         rv = EXR_ERR_SUCCESS;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (list)
    {
        if (list->entries)
        {
            for (int i = 0; i < list->num_attributes; ++i)
            {
                arv = attr_destroy (pctxt, list->entries[i]);
                if (arv != EXR_ERR_SUCCESS) rv = arv;
            }
            pctxt->free_fn (list->entries);
        }
        *list = nil;
    }
    return rv;
}